

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void textcolor_cb(Fl_Button *i,void *v)

{
  int iVar1;
  Fl_Color FVar2;
  bool bVar3;
  Fl_Widget_Type *q;
  Fl_Type *pFVar4;
  int s;
  Fl_Font n;
  Fl_Color local_3c;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  
  if ((char *)v == "LOAD") {
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])
                      (current_widget,0,local_34,local_38,&local_3c);
    if (iVar1 == 0) {
      Fl_Widget::deactivate(&i->super_Fl_Widget);
      return;
    }
    Fl_Widget::activate(&i->super_Fl_Widget);
  }
  else {
    FVar2 = (i->super_Fl_Widget).color_;
    local_3c = fl_show_colormap(FVar2);
    if (local_3c == FVar2) {
      return;
    }
    if (Fl_Type::first != (Fl_Type *)0x0) {
      bVar3 = true;
      pFVar4 = Fl_Type::first;
      do {
        while ((pFVar4->selected == '\0' ||
               (iVar1 = (*pFVar4->_vptr_Fl_Type[0x17])(pFVar4), iVar1 == 0))) {
          pFVar4 = pFVar4->next;
          if (pFVar4 == (Fl_Type *)0x0) {
            if (bVar3) goto LAB_00185dfc;
            goto LAB_00185df2;
          }
        }
        (*pFVar4->_vptr_Fl_Type[0x2b])(pFVar4,3,local_34,local_38,&local_3c);
        Fl_Widget::redraw((Fl_Widget *)pFVar4[1].prev);
        pFVar4 = pFVar4->next;
        bVar3 = false;
      } while (pFVar4 != (Fl_Type *)0x0);
LAB_00185df2:
      set_modflag(1);
    }
  }
LAB_00185dfc:
  (i->super_Fl_Widget).color_ = local_3c;
  FVar2 = fl_contrast(0x38,local_3c);
  (i->super_Fl_Widget).label_.color = FVar2;
  Fl_Widget::redraw(&i->super_Fl_Widget);
  return;
}

Assistant:

void textcolor_cb(Fl_Button* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
  } else {
    int mod = 0;
    c = i->color();
    Fl_Color d = fl_show_colormap(c);
    if (d == c) return;
    c = d;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(3,n,s,c); q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->color(c); i->labelcolor(fl_contrast(FL_BLACK,c)); i->redraw();
}